

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_sync_client_lifecycle_functions(t_rs_generator *this,string *client_struct)

{
  ostream *poVar1;
  string local_88;
  string local_68;
  string local_38;
  string *local_18;
  string *client_struct_local;
  t_rs_generator *this_local;
  
  local_18 = client_struct;
  client_struct_local = (string *)this;
  t_generator::indent_abi_cxx11_(&local_38,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"pub fn new(input_protocol: IP, output_protocol: OP) -> ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  poVar1 = std::operator<<(poVar1,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar1 = std::operator<<(poVar1," {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_38);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_68,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_68);
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  poVar1 = std::operator<<(poVar1,
                           " { _i_prot: input_protocol, _o_prot: output_protocol, _sequence_number: 0 }"
                          );
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_68);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_88,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_88);
  poVar1 = std::operator<<(poVar1,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void t_rs_generator::render_sync_client_lifecycle_functions(const string& client_struct) {
  f_gen_
    << indent()
    << "pub fn new(input_protocol: IP, output_protocol: OP) -> "
    << client_struct
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " {"
    << endl;
  indent_up();

  f_gen_
    << indent()
    << client_struct
    << " { _i_prot: input_protocol, _o_prot: output_protocol, _sequence_number: 0 }"
    << endl;

  indent_down();
  f_gen_ << indent() << "}" << endl;
}